

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tableview.cpp
# Opt level: O2

int __thiscall
QtMWidgets::TableViewSectionPrivate::init(TableViewSectionPrivate *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  QVBoxLayout *this_00;
  TextLabel *pTVar2;
  QFont font;
  
  QWidget::setSizePolicy((QSizePolicy)SUB84(this->q,0));
  QWidget::setBackgroundRole((ColorRole)this->q);
  QWidget::setAutoFillBackground(SUB81(this->q,0));
  this_00 = (QVBoxLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout(this_00,&this->q->super_QWidget);
  this->layout = this_00;
  (**(code **)(*(long *)this_00 + 0x68))(this_00);
  QLayout::setContentsMargins((int)this->layout,0,0,0);
  pTVar2 = (TextLabel *)operator_new(0x30);
  TextLabel::TextLabel(pTVar2,&this->q->super_QWidget,(WindowFlags)0x0);
  this->header = pTVar2;
  QWidget::setBackgroundRole((ColorRole)pTVar2);
  QWidget::setAutoFillBackground(SUB81(this->header,0));
  TextLabel::setMargin(this->header,0xb);
  QWidget::setSizePolicy((QSizePolicy)SUB84(this->header,0));
  QBoxLayout::addWidget(this->layout,this->header,0,0);
  pTVar2 = (TextLabel *)operator_new(0x30);
  TextLabel::TextLabel(pTVar2,&this->q->super_QWidget,(WindowFlags)0x0);
  this->footer = pTVar2;
  QFont::QFont(&font,(QFont *)(*(long *)&pTVar2->field_0x20 + 0x38));
  QFont::pointSize();
  QFont::setPointSize((int)&font);
  TextLabel::setFont(this->footer,&font);
  QWidget::setBackgroundRole((ColorRole)this->footer);
  QWidget::setAutoFillBackground(SUB81(this->footer,0));
  TextLabel::setMargin(this->footer,0xb);
  QWidget::setSizePolicy((QSizePolicy)SUB84(this->footer,0));
  QBoxLayout::addWidget(this->layout,this->footer,0,0);
  iVar1 = QFont::~QFont(&font);
  return iVar1;
}

Assistant:

void
TableViewSectionPrivate::init()
{
	q->setSizePolicy( QSizePolicy::Minimum, QSizePolicy::Fixed );
	q->setBackgroundRole( QPalette::Base );
	q->setAutoFillBackground( true );

	layout = new QVBoxLayout( q );
	layout->setSpacing( 0 );
	layout->setContentsMargins( 0, 0, 0, 0 );

	QSizePolicy sp( QSizePolicy::Minimum, QSizePolicy::Fixed );
	sp.setHeightForWidth( true );

	header = new TextLabel( q );
	header->setBackgroundRole( QPalette::Midlight );
	header->setAutoFillBackground( true );
	header->setMargin( 11 );
	header->setSizePolicy( sp );
	layout->addWidget( header );

	footer = new TextLabel( q );
	QFont font = footer->font();
	font.setPointSize( qMax( font.pointSize() - 1, 5 ) );
	footer->setFont( font );
	footer->setBackgroundRole( QPalette::Midlight );
	footer->setAutoFillBackground( true );
	footer->setMargin( 11 );
	footer->setSizePolicy( sp );
	layout->addWidget( footer );
}